

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O0

bool __thiscall
HPack::Encoder::encodeRequestPseudoHeaders
          (Encoder *this,BitOStream *outputStream,HttpHeader *header)

{
  QByteArrayView t;
  QByteArrayView t_00;
  bool bVar1;
  bool bVar2;
  Encoder *in_RDX;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  size_type i;
  size_type j;
  HeaderField *field;
  HttpHeader *__range1;
  size_type nHeaders;
  bool methodFound;
  const_iterator __end1;
  const_iterator __begin1;
  bool headerFound [3];
  QByteArrayView headerName [3];
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  int line;
  QByteArray *in_stack_fffffffffffffe68;
  char *file;
  HeaderField *in_stack_fffffffffffffe70;
  reference in_stack_fffffffffffffe78;
  storage_type *psVar3;
  QByteArrayView *t_01;
  bool local_149;
  QDebug local_118;
  char local_110 [32];
  undefined8 local_f0;
  undefined8 local_e8;
  QDebug local_c0 [3];
  char *local_a8;
  char local_a0 [32];
  char *local_80;
  char local_78 [32];
  char *local_58;
  HeaderField *local_50;
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  local_48;
  byte local_3b [11];
  undefined8 auStack_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  t_01 = in_RDI;
  memcpy(local_3b + 3,&DAT_0049d540,0x30);
  psVar3 = (storage_type *)0x3;
  memset(local_3b,0,3);
  local_48._M_current = (HeaderField *)0xaaaaaaaaaaaaaaaa;
  local_48._M_current =
       (HeaderField *)
       std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::begin
                 ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)in_RDI);
  local_50 = (HeaderField *)0xaaaaaaaaaaaaaaaa;
  local_50 = (HeaderField *)
             std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::end
                       ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)), bVar1
        ) {
    in_stack_fffffffffffffe78 =
         __gnu_cxx::
         __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
         ::operator*(&local_48);
    local_58 = ":status";
    bVar1 = ::operator==(&in_stack_fffffffffffffe70->name,(char **)in_stack_fffffffffffffe68);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      QMessageLogger::critical(local_78,"invalid pseudo-header (:status) in a request");
      local_149 = false;
      goto LAB_00290b9f;
    }
    local_80 = ":method";
    bVar1 = ::operator==(&in_stack_fffffffffffffe70->name,(char **)in_stack_fffffffffffffe68);
    if (bVar1) {
      if (bVar2) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                   (int)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        QMessageLogger::critical(local_a0,"only one :method pseudo-header is allowed");
        local_149 = false;
        goto LAB_00290b9f;
      }
      bVar2 = encodeMethod(in_RDX,(BitOStream *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70)
      ;
      if (!bVar2) {
        local_149 = false;
        goto LAB_00290b9f;
      }
      bVar2 = true;
    }
    else {
      local_a8 = "cookie";
      bVar1 = ::operator==(&in_stack_fffffffffffffe70->name,(char **)in_stack_fffffffffffffe68);
      if (!bVar1) {
        for (in_stack_fffffffffffffe70 = (HeaderField *)0x0;
            in_stack_fffffffffffffe70 < (HeaderField *)0x3;
            in_stack_fffffffffffffe70 =
                 (HeaderField *)((long)&(in_stack_fffffffffffffe70->name).d.d + 1)) {
          QByteArrayView::QByteArrayView<QByteArray,_true>
                    ((QByteArrayView *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          bVar1 = ::operator==(in_RDI,(QByteArrayView *)
                                      CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58))
          ;
          if (bVar1) {
            if ((local_3b[(long)in_stack_fffffffffffffe70] & 1) != 0) {
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffffe70,
                         (char *)in_stack_fffffffffffffe68,(int)((ulong)in_RDI >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
              QMessageLogger::critical();
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffe78,(char *)t_01);
              local_f0 = *(undefined8 *)(local_3b + (long)in_stack_fffffffffffffe70 * 0x10 + 3);
              local_e8 = auStack_30[(long)in_stack_fffffffffffffe70 * 2];
              t.m_data = psVar3;
              t.m_size = (qsizetype)in_RDX;
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffe78,t);
              QDebug::operator<<((QDebug *)in_stack_fffffffffffffe78,(char *)t_01);
              QDebug::~QDebug(local_c0);
              local_149 = false;
              goto LAB_00290b9f;
            }
            bVar1 = encodeHeaderField(in_RDX,(BitOStream *)in_stack_fffffffffffffe78,
                                      in_stack_fffffffffffffe70);
            if (!bVar1) {
              local_149 = false;
              goto LAB_00290b9f;
            }
            local_3b[(long)in_stack_fffffffffffffe70] = 1;
            break;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
    ::operator++(&local_48);
  }
  line = (int)((ulong)in_RDI >> 0x20);
  if (bVar2) {
    for (file = (char *)0x1; file < (char *)0x3; file = file + 1) {
      if ((local_3b[(long)file] & 1) == 0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffe70,file,line,
                   (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        QMessageLogger::critical();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffe78,(char *)t_01);
        t_00.m_data = psVar3;
        t_00.m_size = (qsizetype)in_RDX;
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffe78,t_00);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffe78,(char *)t_01);
        QDebug::~QDebug(&local_118);
        local_149 = false;
        goto LAB_00290b9f;
      }
    }
    local_149 = true;
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,line,
               (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    QMessageLogger::critical(local_110,"mandatory :method pseudo-header not found");
    local_149 = false;
  }
LAB_00290b9f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_149;
}

Assistant:

bool Encoder::encodeRequestPseudoHeaders(BitOStream &outputStream,
                                         const HttpHeader &header)
{
    // The following pseudo-header fields are defined for HTTP/2 requests:
    // - The :method pseudo-header field includes the HTTP method
    // - The :scheme pseudo-header field includes the scheme portion of the target URI
    // - The :authority pseudo-header field includes the authority portion of the target URI
    // - The :path pseudo-header field includes the path and query parts of the target URI

    // All HTTP/2 requests MUST include exactly one valid value for the :method,
    // :scheme, and :path pseudo-header fields, unless it is a CONNECT request
    // (Section 8.3). An HTTP request that omits mandatory pseudo-header fields
    // is malformed (Section 8.1.2.6).

    using size_type = decltype(header.size());

    bool methodFound = false;
    constexpr QByteArrayView headerName[] = {":authority", ":scheme", ":path"};
    constexpr size_type nHeaders = std::size(headerName);
    bool headerFound[nHeaders] = {};

    for (const auto &field : header) {
        if (field.name == ":status") {
            qCritical("invalid pseudo-header (:status) in a request");
            return false;
        }

        if (field.name == ":method") {
            if (methodFound) {
                qCritical("only one :method pseudo-header is allowed");
                return false;
            }

            if (!encodeMethod(outputStream, field))
                return false;
            methodFound = true;
        } else if (field.name == "cookie") {
            // "crumbs" ...
        } else {
            for (size_type j = 0; j < nHeaders; ++j) {
                if (field.name == headerName[j]) {
                    if (headerFound[j]) {
                        qCritical() << "only one" << headerName[j] << "pseudo-header is allowed";
                        return false;
                    }
                    if (!encodeHeaderField(outputStream, field))
                        return false;
                    headerFound[j] = true;
                    break;
                }
            }
        }
    }

    if (!methodFound) {
        qCritical("mandatory :method pseudo-header not found");
        return false;
    }

    // 1: don't demand headerFound[0], as :authority isn't mandatory.
    for (size_type i = 1; i < nHeaders; ++i) {
        if (!headerFound[i]) {
            qCritical() << "mandatory" << headerName[i]
                        << "pseudo-header not found";
            return false;
        }
    }

    return true;
}